

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O3

void __thiscall wasm::TypeBuilder::dump(TypeBuilder *this)

{
  _Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false> _Var1;
  HeapType type;
  byte bVar2;
  pointer pHVar3;
  long *extraout_RAX;
  long *extraout_RAX_00;
  long *plVar4;
  ostream *poVar5;
  long *plVar6;
  size_t i;
  undefined1 auVar7 [8];
  undefined1 local_128 [8];
  IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> print;
  _Any_data local_88;
  code *local_78;
  string local_68;
  undefined1 auStack_48 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> types;
  
  auStack_48 = (undefined1  [8])0x0;
  types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  _Var1._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
       .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
  if (*(pointer *)((long)&(_Var1._M_head_impl)->entries + 8) !=
      *(pointer *)
       &((_Var1._M_head_impl)->entries).
        super__Vector_base<wasm::TypeBuilder::Impl::Entry,_std::allocator<wasm::TypeBuilder::Impl::Entry>_>
     ) {
    i = 0;
    do {
      local_128 = (undefined1  [8])getTempHeapType(this,i);
      if (types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_start ==
          types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::
        _M_realloc_insert<wasm::HeapType>
                  ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_48,
                   (iterator)
                   types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
                   .super__Vector_impl_data._M_start,(HeapType *)local_128);
      }
      else {
        (types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
         super__Vector_impl_data._M_start)->id = (uintptr_t)local_128;
        types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_start =
             types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      }
      i = i + 1;
      _Var1._M_head_impl =
           (this->impl)._M_t.
           super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
           ._M_t.
           super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
           .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
    } while (i < (ulong)((long)*(pointer *)((long)&(_Var1._M_head_impl)->entries + 8) -
                         *(long *)&((_Var1._M_head_impl)->entries).
                                   super__Vector_base<wasm::TypeBuilder::Impl::Entry,_std::allocator<wasm::TypeBuilder::Impl::Entry>_>
                        >> 4));
  }
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
  IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>::
  IndexedTypeNameGenerator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
            ((IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> *)local_128,
             (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_48,
             (DefaultTypeNameGenerator *)local_128,&local_68);
  plVar4 = extraout_RAX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    plVar4 = extraout_RAX_00;
  }
  pHVar3 = types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (auStack_48 !=
      (undefined1  [8])
      types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_start) {
    bVar2 = 0;
    auVar7 = auStack_48;
    do {
      type.id = ((pointer)auVar7)->id;
      if (type.id < 0x7d) {
        __assert_fail("!isBasic()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                      ,0x4ed,"RecGroup wasm::HeapType::getRecGroup() const");
      }
      plVar6 = (long *)(type.id | 1);
      if (*(long **)(type.id + 0x20) != (long *)0x0) {
        plVar6 = *(long **)(type.id + 0x20);
      }
      if ((bVar2 == 0) || (plVar6 != plVar4)) {
        if ((((~bVar2 | (byte)plVar4) & 1) == 0) && (8 < (ulong)(plVar4[1] - *plVar4))) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,")\n",2);
        }
        if ((((ulong)plVar6 & 1) == 0) && (8 < (ulong)(plVar6[1] - *plVar6))) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(rec\n",5);
        }
        plVar4 = plVar6;
        if (bVar2 == 0) {
          bVar2 = 1;
        }
      }
      if ((((ulong)plVar4 & 1) == 0) && (8 < (ulong)(plVar4[1] - *plVar4))) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"  ",2);
      }
      TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>::
      operator()((Printed *)&print.names._M_h._M_single_bucket,
                 (TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>
                  *)local_128,type);
      poVar5 = wasm::operator<<((ostream *)&std::cerr,(Printed *)&print.names._M_h._M_single_bucket)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      if (local_78 != (code *)0x0) {
        (*local_78)(&local_88,&local_88,__destroy_functor);
      }
      auVar7 = (undefined1  [8])((long)auVar7 + 8);
    } while (auVar7 != (undefined1  [8])pHVar3);
    if (((bool)(((ulong)plVar4 & 1) == 0 & bVar2)) && (8 < (ulong)(plVar4[1] - *plVar4))) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,")\n",2);
    }
  }
  std::
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&print.fallback);
  std::
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&print.defaultGenerator.arrayCount);
  if (auStack_48 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_48,
                    (long)types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)auStack_48);
  }
  return;
}

Assistant:

void TypeBuilder::dump() {
  std::vector<HeapType> types;
  for (size_t i = 0; i < size(); ++i) {
    types.push_back((*this)[i]);
  }
  IndexedTypeNameGenerator<DefaultTypeNameGenerator> print(types);

  std::optional<RecGroup> currGroup;
  for (auto type : types) {
    if (auto newGroup = type.getRecGroup(); newGroup != currGroup) {
      if (currGroup && currGroup->size() > 1) {
        std::cerr << ")\n";
      }
      if (newGroup.size() > 1) {
        std::cerr << "(rec\n";
      }
      currGroup = newGroup;
    }
    if (currGroup->size() > 1) {
      std::cerr << "  ";
    }
    std::cerr << print(type) << "\n";
  }
  if (currGroup && currGroup->size() > 1) {
    std::cerr << ")\n";
  }
}